

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void __thiscall NAPComm::NAPComm(NAPComm *this,topo_data *_topo_info)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  comm_pkg *in_stack_ffffffffffffffe0;
  
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  pvVar1 = operator_new(0x10);
  comm_pkg::comm_pkg(in_stack_ffffffffffffffe0);
  *in_RDI = pvVar1;
  pvVar1 = operator_new(0x10);
  comm_pkg::comm_pkg(in_stack_ffffffffffffffe0);
  in_RDI[1] = pvVar1;
  pvVar1 = operator_new(0x10);
  comm_pkg::comm_pkg(in_stack_ffffffffffffffe0);
  in_RDI[2] = pvVar1;
  pvVar1 = operator_new(0x10);
  comm_pkg::comm_pkg(in_stack_ffffffffffffffe0);
  in_RDI[3] = pvVar1;
  in_RDI[7] = in_RSI;
  return;
}

Assistant:

NAPComm(topo_data* _topo_info)
    {
        buffer_size = 0;
        send_requests = NULL;
        recv_requests = NULL;
        local_L_comm = new comm_pkg();
        local_R_comm = new comm_pkg();
        local_S_comm = new comm_pkg();
        global_comm = new comm_pkg();
        topo_info = _topo_info;
    }